

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# last.cpp
# Opt level: O2

void breathing_test(bool verbose)

{
  bool bVar1;
  ostream *poVar2;
  Framer framer;
  string local_130;
  pstring astring;
  test_resource tpmr;
  
  Framer::Framer(&framer,"breathing test",verbose);
  std::pmr::test_resource::test_resource(&tpmr,"object",verbose);
  pstring::pstring(&astring,"barfool",(allocator_type)&tpmr);
  pstring::str_abi_cxx11_(&local_130,&astring);
  bVar1 = std::operator!=(&local_130,"barfool");
  std::__cxx11::string::~string((string *)&local_130);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"astring.str()");
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"\"barfool\"");
    std::operator<<(poVar2,'\n');
    pstring::str_abi_cxx11_(&local_130,&astring);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_130);
    poVar2 = std::operator<<(poVar2," != ");
    poVar2 = std::operator<<(poVar2,"barfool");
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&local_130);
    errorCount = errorCount + 1;
  }
  pstring::~pstring(&astring);
  std::pmr::test_resource::~test_resource(&tpmr);
  Framer::~Framer(&framer);
  return;
}

Assistant:

void breathing_test(bool verbose)
{
    Framer framer{ "breathing test", verbose };

    std::pmr::test_resource tpmr{ "object", verbose };

    pstring astring{ "barfool", &tpmr };

    ASSERT_EQ(astring.str(), "barfool");
}